

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O2

void __thiscall ASN1Test_SetTime_Test::TestBody(ASN1Test_SetTime_Test *this)

{
  anon_struct_32_4_837a7bc6 *message;
  char **ppcVar1;
  time_t t;
  AssertionResult *pAVar2;
  bool bVar3;
  int iVar4;
  pointer *__ptr;
  _Head_base<0UL,_asn1_string_st_*,_false> _Var5;
  _Head_base<0UL,_asn1_string_st_*,_false> _Var6;
  char *pcVar7;
  char *pcVar8;
  char *in_R9;
  char **lhs;
  long lVar9;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_1014;
  UniquePtr<ASN1_TIME> choice;
  UniquePtr<ASN1_GENERALIZEDTIME> generalized;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  UniquePtr<ASN1_UTCTIME> utc;
  AssertHelper local_60;
  int64_t tt;
  char **local_50;
  anon_struct_32_4_837a7bc6 *local_48;
  long local_40;
  char *local_38;
  
  lVar9 = 0x1a0;
  lhs = &TestBody::kTests[0].utc;
  do {
    if (lVar9 == 0) {
      return;
    }
    message = (anon_struct_32_4_837a7bc6 *)(lhs + -2);
    testing::ScopedTrace::ScopedTrace<long>
              (&gtest_trace_1014,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x3f6,(long *)message);
    t = message->time;
    local_48 = message;
    utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         ASN1_UTCTIME_set((ASN1_UTCTIME *)0x0,t);
    local_38 = *lhs;
    if (local_38 == (char *)0x0) {
      gtest_ar_._1_7_ = gtest_ar_._1_7_;
      gtest_ar_.success_ =
           (_Head_base<0UL,_asn1_string_st_*,_false>)
           utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if ((_Head_base<0UL,_asn1_string_st_*,_false>)
          utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&generalized);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48c868,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&choice,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x403,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&generalized);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
        std::__cxx11::string::~string((string *)&gtest_ar);
        _Var5._M_head_impl = (asn1_string_st *)generalized;
LAB_001af8ce:
        if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)_Var5._M_head_impl !=
            (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
          (**(code **)(*(long *)_Var5._M_head_impl + 8))();
        }
      }
    }
    else {
      gtest_ar_._1_7_ = gtest_ar_._1_7_;
      gtest_ar_.success_ =
           (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
           utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
          utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&generalized);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48c868,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&choice,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fa,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&generalized);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)
            generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)generalized._M_t.
                                super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        goto LAB_001b0545;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 0x17;
      iVar4 = ASN1_STRING_type((ASN1_STRING *)
                               utc._M_t.
                               super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
      generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = iVar4;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"23","ASN1_STRING_type(utc.get())",(int *)&gtest_ar_,
                 (int *)&generalized);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fb,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_ = (AssertionResult)
                  ASN1StringToStringView
                            ((ASN1_STRING *)
                             utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                             ._M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                             .super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
      testing::internal::
      CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                ((internal *)&gtest_ar,"t.utc","ASN1StringToStringView(utc.get())",lhs,
                 (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fc,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar3 = ASN1Time_check_posix
                        ((ASN1_TIME *)
                         utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,t);
      gtest_ar_.success_ = bVar3;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if (!bVar3) {
        testing::Message::Message((Message *)&generalized);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"ASN1Time_check_posix(utc.get(), t.time)","false","true",in_R9
                  );
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&choice,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&generalized);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)
            generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0) {
          (**(code **)(*(long *)generalized._M_t.
                                super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar4 = ASN1_TIME_to_posix((ASN1_TIME *)
                                 utc._M_t.
                                 super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,&tt);
      gtest_ar_._0_4_ = iVar4;
      generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"ASN1_TIME_to_posix(utc.get(), &tt)","1",(int *)&gtest_ar_,
                 (int *)&generalized);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3fe,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"tt","t.time",&tt,&local_48->time);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3ff,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      PrintStringToBIO_abi_cxx11_
                ((string *)&gtest_ar,
                 (ASN1_STRING *)
                 utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,ASN1_UTCTIME_print);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                ((internal *)&gtest_ar_,"PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print)",
                 "t.printed",(string *)&gtest_ar,lhs + 1);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x400,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      PrintStringToBIO_abi_cxx11_
                ((string *)&gtest_ar,
                 (ASN1_STRING *)
                 utc._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,ASN1_TIME_print);
      testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                ((internal *)&gtest_ar_,"PrintStringToBIO(utc.get(), &ASN1_TIME_print)","t.printed",
                 (string *)&gtest_ar,lhs + 1);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&generalized,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x401,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&generalized,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&generalized);
        _Var5._M_head_impl._1_7_ = gtest_ar._1_7_;
        _Var5._M_head_impl._0_1_ = gtest_ar.success_;
        goto LAB_001af8ce;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    local_40 = lVar9;
    generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         ASN1_GENERALIZEDTIME_set((ASN1_GENERALIZEDTIME *)0x0,t);
    pcVar7 = lhs[-1];
    local_50 = lhs;
    if (pcVar7 != (char *)0x0) {
      gtest_ar_._1_7_ = gtest_ar_._1_7_;
      gtest_ar_.success_ =
           (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
           generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
          generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        gtest_ar_._0_4_ = 0x18;
        iVar4 = ASN1_STRING_type((ASN1_STRING *)
                                 generalized._M_t.
                                 super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = iVar4;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"24","ASN1_STRING_type(generalized.get())",
                   (int *)&gtest_ar_,(int *)&choice);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40a,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_ = (AssertionResult)
                    ASN1StringToStringView
                              ((ASN1_STRING *)
                               generalized._M_t.
                               super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)&gtest_ar,"t.generalized","ASN1StringToStringView(generalized.get())"
                   ,lhs + -1,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40b,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        bVar3 = ASN1Time_check_posix
                          ((ASN1_TIME *)
                           generalized._M_t.
                           super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,t);
        gtest_ar_.success_ = bVar3;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )0x0;
        if (!bVar3) {
          testing::Message::Message((Message *)&choice);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"ASN1Time_check_posix(generalized.get(), t.time)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40c,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&choice);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if ((__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)
              choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0) {
            (**(code **)(*(long *)choice._M_t.
                                  super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 8))
                      ();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar4 = ASN1_TIME_to_posix((ASN1_TIME *)
                                   generalized._M_t.
                                   super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                                   _M_t.
                                   super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,&tt)
        ;
        gtest_ar_._0_4_ = iVar4;
        choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl._0_4_ = 1;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"ASN1_TIME_to_posix(generalized.get(), &tt)","1",
                   (int *)&gtest_ar_,(int *)&choice);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40d,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&gtest_ar,"tt","t.time",&tt,&local_48->time);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x40e,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        PrintStringToBIO_abi_cxx11_
                  ((string *)&gtest_ar,
                   (ASN1_STRING *)
                   generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,
                   ASN1_GENERALIZEDTIME_print);
        ppcVar1 = local_50 + 1;
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)&gtest_ar_,
                   "PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print)","t.printed",
                   (string *)&gtest_ar,ppcVar1);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x411,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        PrintStringToBIO_abi_cxx11_
                  ((string *)&gtest_ar,
                   (ASN1_STRING *)
                   generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                   _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,ASN1_TIME_print);
        testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                  ((internal *)&gtest_ar_,"PrintStringToBIO(generalized.get(), &ASN1_TIME_print)",
                   "t.printed",(string *)&gtest_ar,ppcVar1);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar);
          pcVar8 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar8 = *(char **)gtest_ar_.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&choice,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x413,pcVar8);
          testing::internal::AssertHelper::operator=((AssertHelper *)&choice,(Message *)&gtest_ar);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&choice);
          _Var6._M_head_impl._1_7_ = gtest_ar._1_7_;
          _Var6._M_head_impl._0_1_ = gtest_ar.success_;
          goto LAB_001afe11;
        }
        goto LAB_001afe1c;
      }
      testing::Message::Message((Message *)&choice);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48c972,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x409,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&choice);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)
          choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)choice._M_t.
                              super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
LAB_001b053b:
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&generalized);
LAB_001b0545:
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&utc);
      testing::ScopedTrace::~ScopedTrace(&gtest_trace_1014);
      return;
    }
    gtest_ar_._1_7_ = gtest_ar_._1_7_;
    gtest_ar_.success_ =
         (_Head_base<0UL,_asn1_string_st_*,_false>)
         generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
         (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    if ((_Head_base<0UL,_asn1_string_st_*,_false>)
        generalized._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
        (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&choice);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48c972,"true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x415,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&choice);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      std::__cxx11::string::~string((string *)&gtest_ar);
      _Var6._M_head_impl = (asn1_string_st *)choice;
LAB_001afe11:
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)_Var6._M_head_impl !=
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        (**(code **)(*(long *)_Var6._M_head_impl + 8))();
      }
    }
LAB_001afe1c:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
         ASN1_TIME_set_posix((ASN1_TIME *)0x0,t);
    lVar9 = local_40;
    ppcVar1 = local_50;
    if (pcVar7 == (char *)0x0) {
      gtest_ar_._1_7_ = gtest_ar_._1_7_;
      gtest_ar_.success_ =
           (_Head_base<0UL,_asn1_string_st_*,_false>)
           choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if ((_Head_base<0UL,_asn1_string_st_*,_false>)
          choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48eea1,"true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x426,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) + 8))();
        }
      }
      pAVar2 = &gtest_ar_;
    }
    else {
      gtest_ar_._1_7_ = gtest_ar_._1_7_;
      gtest_ar_.success_ =
           (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
           choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
           (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
          choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x48eea1,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x41a,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&choice);
        goto LAB_001b053b;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      if (local_38 == (char *)0x0) {
        gtest_ar_._0_4_ = 0x18;
        local_90.data_._0_4_ =
             ASN1_STRING_type((ASN1_STRING *)
                              choice._M_t.
                              super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"24","ASN1_STRING_type(choice.get())",(int *)&gtest_ar_,
                   (int *)&local_90);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar7 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41f,pcVar7);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_ = (AssertionResult)
                    ASN1StringToStringView
                              ((ASN1_STRING *)
                               choice._M_t.
                               super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)&gtest_ar,"t.generalized","ASN1StringToStringView(choice.get())",
                   lhs + -1,(basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar7 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x420,pcVar7);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
          goto LAB_001b0161;
        }
      }
      else {
        gtest_ar_._0_4_ = 0x17;
        local_90.data_._0_4_ =
             ASN1_STRING_type((ASN1_STRING *)
                              choice._M_t.
                              super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"23","ASN1_STRING_type(choice.get())",(int *)&gtest_ar_,
                   (int *)&local_90);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar7 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41c,pcVar7);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_ = (AssertionResult)
                    ASN1StringToStringView
                              ((ASN1_STRING *)
                               choice._M_t.
                               super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
        testing::internal::
        CmpHelperEQ<char_const*,std::basic_string_view<char,std::char_traits<char>>>
                  ((internal *)&gtest_ar,"t.utc","ASN1StringToStringView(choice.get())",ppcVar1,
                   (basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar7 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar7 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x41d,pcVar7);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
LAB_001b0161:
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      bVar3 = ASN1Time_check_posix
                        ((ASN1_TIME *)
                         choice._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,t);
      gtest_ar_.success_ = bVar3;
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      if (!bVar3) {
        testing::Message::Message((Message *)&local_90);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"ASN1Time_check_posix(choice.get(), t.time)","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x422,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_90);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90.data_._4_4_,(int)local_90.data_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar4 = ASN1_TIME_to_posix((ASN1_TIME *)
                                 choice._M_t.
                                 super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t
                                 .super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,&tt);
      gtest_ar_._0_4_ = iVar4;
      local_90.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"ASN1_TIME_to_posix(choice.get(), &tt)","1",(int *)&gtest_ar_
                 ,(int *)&local_90);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x423,pcVar7);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&gtest_ar,"tt","t.time",&tt,&local_48->time);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        pcVar7 = "";
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar7 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x424,pcVar7);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      pAVar2 = &gtest_ar;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&pAVar2->message_);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&choice);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&generalized);
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&utc);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1014);
    lVar9 = lVar9 + -0x20;
    lhs = ppcVar1 + 4;
  } while( true );
}

Assistant:

TEST(ASN1Test, SetTime) {
  static const struct {
    int64_t time;
    const char *generalized;
    const char *utc;
    const char *printed;
  } kTests[] = {
      {-631152001, "19491231235959Z", nullptr, "Dec 31 23:59:59 1949 GMT"},
      {-631152000, "19500101000000Z", "500101000000Z",
       "Jan  1 00:00:00 1950 GMT"},
      {0, "19700101000000Z", "700101000000Z", "Jan  1 00:00:00 1970 GMT"},
      {981173106, "20010203040506Z", "010203040506Z",
       "Feb  3 04:05:06 2001 GMT"},
      {951804000, "20000229060000Z", "000229060000Z",
       "Feb 29 06:00:00 2000 GMT"},
      // NASA says this is the correct time for posterity.
      {-16751025, "19690621025615Z", "690621025615Z",
       "Jun 21 02:56:15 1969 GMT"},
      // -1 is sometimes used as an error value. Ensure we correctly handle it.
      {-1, "19691231235959Z", "691231235959Z", "Dec 31 23:59:59 1969 GMT"},
      {2524607999, "20491231235959Z", "491231235959Z",
       "Dec 31 23:59:59 2049 GMT"},
      {2524608000, "20500101000000Z", nullptr, "Jan  1 00:00:00 2050 GMT"},
      // Test boundary conditions.
      {-62167219200, "00000101000000Z", nullptr, "Jan  1 00:00:00 0 GMT"},
      {-62167219201, nullptr, nullptr, nullptr},
      {253402300799, "99991231235959Z", nullptr, "Dec 31 23:59:59 9999 GMT"},
      {253402300800, nullptr, nullptr, nullptr},
  };
  for (const auto &t : kTests) {
    int64_t tt;
    SCOPED_TRACE(t.time);

    bssl::UniquePtr<ASN1_UTCTIME> utc(ASN1_UTCTIME_set(nullptr, t.time));
    if (t.utc) {
      ASSERT_TRUE(utc);
      EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(utc.get()));
      EXPECT_EQ(t.utc, ASN1StringToStringView(utc.get()));
      EXPECT_TRUE(ASN1Time_check_posix(utc.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(utc.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_UTCTIME_print), t.printed);
      EXPECT_EQ(PrintStringToBIO(utc.get(), &ASN1_TIME_print), t.printed);
    } else {
      EXPECT_FALSE(utc);
    }

    bssl::UniquePtr<ASN1_GENERALIZEDTIME> generalized(
        ASN1_GENERALIZEDTIME_set(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(generalized);
      EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(generalized.get()));
      EXPECT_EQ(t.generalized, ASN1StringToStringView(generalized.get()));
      EXPECT_TRUE(ASN1Time_check_posix(generalized.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(generalized.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
      EXPECT_EQ(
          PrintStringToBIO(generalized.get(), &ASN1_GENERALIZEDTIME_print),
          t.printed);
      EXPECT_EQ(PrintStringToBIO(generalized.get(), &ASN1_TIME_print),
                t.printed);
    } else {
      EXPECT_FALSE(generalized);
    }

    bssl::UniquePtr<ASN1_TIME> choice(ASN1_TIME_set_posix(nullptr, t.time));
    if (t.generalized) {
      ASSERT_TRUE(choice);
      if (t.utc) {
        EXPECT_EQ(V_ASN1_UTCTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.utc, ASN1StringToStringView(choice.get()));
      } else {
        EXPECT_EQ(V_ASN1_GENERALIZEDTIME, ASN1_STRING_type(choice.get()));
        EXPECT_EQ(t.generalized, ASN1StringToStringView(choice.get()));
      }
      EXPECT_TRUE(ASN1Time_check_posix(choice.get(), t.time));
      EXPECT_EQ(ASN1_TIME_to_posix(choice.get(), &tt), 1);
      EXPECT_EQ(tt, t.time);
    } else {
      EXPECT_FALSE(choice);
    }
  }
}